

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testravidebug.c
# Opt level: O2

int test_initreq(void)

{
  void *__s1;
  int iVar1;
  size_t sVar2;
  uint uVar3;
  membuff_t mb;
  char testdata2 [173];
  char testdata [200];
  ProtocolMessage msg;
  ProtocolMessage res;
  
  testdata[0xc0] = '\0';
  testdata[0xc1] = '\0';
  testdata[0xc2] = '\0';
  testdata[0xc3] = '\0';
  testdata[0xc4] = '\0';
  testdata[0xc5] = '\0';
  testdata[0xc6] = '\0';
  testdata[199] = '\0';
  builtin_strncpy(testdata + 0x80,"sStartAt1\":true}}",0x12);
  testdata[0x92] = '\0';
  testdata[0x93] = '\0';
  testdata[0x94] = '\0';
  testdata[0x95] = '\0';
  testdata[0x96] = '\0';
  testdata[0x97] = '\0';
  testdata[0x98] = '\0';
  testdata[0x99] = '\0';
  testdata[0x9a] = '\0';
  testdata[0x9b] = '\0';
  testdata[0x9c] = '\0';
  testdata[0x9d] = '\0';
  testdata[0x9e] = '\0';
  testdata[0x9f] = '\0';
  testdata[0xa0] = '\0';
  testdata[0xa1] = '\0';
  testdata[0xa2] = '\0';
  testdata[0xa3] = '\0';
  testdata[0xa4] = '\0';
  testdata[0xa5] = '\0';
  testdata[0xa6] = '\0';
  testdata[0xa7] = '\0';
  testdata[0xa8] = '\0';
  testdata[0xa9] = '\0';
  testdata[0xaa] = '\0';
  testdata[0xab] = '\0';
  testdata[0xac] = '\0';
  testdata[0xad] = '\0';
  testdata[0xae] = '\0';
  testdata[0xaf] = '\0';
  testdata[0xb0] = '\0';
  testdata[0xb1] = '\0';
  testdata[0xb2] = '\0';
  testdata[0xb3] = '\0';
  testdata[0xb4] = '\0';
  testdata[0xb5] = '\0';
  testdata[0xb6] = '\0';
  testdata[0xb7] = '\0';
  testdata[0xb8] = '\0';
  testdata[0xb9] = '\0';
  testdata[0xba] = '\0';
  testdata[0xbb] = '\0';
  testdata[0xbc] = '\0';
  testdata[0xbd] = '\0';
  testdata[0xbe] = '\0';
  testdata[0xbf] = '\0';
  builtin_strncpy(testdata + 0x40,
                  "dapterID\":\"lua\",\"pathFormat\":\"path\",\"linesStartAt1\":true,\"column",0x40)
  ;
  builtin_strncpy(testdata,
                  "{\"type\":\"request\",\"seq\":1,\"command\":\"initialize\",\"arguments\":{\"a",
                  0x40);
  sVar2 = strlen(testdata);
  iVar1 = vscode_parse_message(testdata,sVar2,&msg,_stderr);
  uVar3 = 1;
  if (((iVar1 == 1) && (msg.seq == 1)) && (msg.type == 1)) {
    __s1 = (void *)((long)&msg.u + 4);
    iVar1 = bcmp(__s1,"initialize",0xb);
    if (((iVar1 == 0) && (msg.u.Event.event_type == 1)) &&
       ((msg.u._40_4_ == 0x61756c && ((msg.u._96_4_ == 1 && (msg.u._92_4_ == 1)))))) {
      iVar1 = bcmp((void *)((long)&msg.u + 100),"path",5);
      if (iVar1 == 0) {
        uVar3 = 1;
        vscode_make_error_response(&msg,&res,1,"unable to initialize");
        membuff_init(&mb,0);
        vscode_serialize_response_new(&mb,&res);
        iVar1 = strcmp("{\"type\":\"response\",\"seq\":1,\"command\":\"initialize\",\"request_seq\":1,\"success\":false,\"message\":\"unable to initialize\"}"
                       ,mb.buf);
        if (iVar1 == 0) {
          uVar3 = 1;
          vscode_make_success_response(&msg,&res,1);
          membuff_rewindpos(&mb);
          vscode_serialize_response_new(&mb,&res);
          iVar1 = strcmp("{\"type\":\"response\",\"seq\":2,\"command\":\"initialize\",\"request_seq\":1,\"success\":true,\"body\":{\"supportsConfigurationDoneRequest\":false,\"supportsFunctionBreakpoints\":false,\"supportsConditionalBreakpoints\":false,\"supportsEvaluateForHovers\":false}}"
                         ,mb.buf);
          if (iVar1 == 0) {
            builtin_strncpy(testdata2 + 0x80,"lines\" : [6],\"breakpoints\" : [{\"line\":6}]} }",
                            0x2d);
            builtin_strncpy(testdata2 + 0x40,
                            ":{\"source\":{\"path\":\"c:\\\\github\\\\ravi\\\\ravi-tests\\\\simple.lua\"},\""
                            ,0x40);
            builtin_strncpy(testdata2,
                            "{\"type\":\"request\",\"seq\":2,\"command\":\"setBreakpoints\",\"arguments\""
                            ,0x40);
            sVar2 = strlen(testdata2);
            iVar1 = vscode_parse_message(testdata2,sVar2,&msg,_stderr);
            uVar3 = 1;
            if (((iVar1 == 6) && (msg.seq == 2)) && (msg.type == 1)) {
              iVar1 = bcmp(__s1,"setBreakpoints",0xf);
              if ((iVar1 == 0) && (msg.u.Event.event_type == 6)) {
                iVar1 = bcmp((void *)((long)&msg.u + 0x5a),"c:/github/ravi/ravi-tests/simple.lua",
                             0x25);
                uVar3 = (uint)(msg.u._944_4_ != 6 || iVar1 != 0);
              }
            }
          }
        }
        membuff_free(&mb);
      }
    }
  }
  return uVar3;
}

Assistant:

int test_initreq() {
  char testdata[200] =
    "{\"type\":\"request\",\"seq\":1,\"command\":\"initialize\","
    "\"arguments\":{\"adapterID\":\"lua\",\"pathFormat\":\"path\","
    "\"linesStartAt1\":true,\"columnsStartAt1\":true}}";
  ProtocolMessage msg;
  int msgtype = vscode_parse_message(testdata, strlen(testdata), &msg, stderr);
  if (msgtype != VSCODE_INITIALIZE_REQUEST || msg.seq != 1 ||
    msg.type != VSCODE_REQUEST ||
    strcmp(msg.u.Request.command, "initialize") != 0 ||
    msg.u.Request.request_type != VSCODE_INITIALIZE_REQUEST ||
    strcmp(msg.u.Request.u.InitializeRequest.adapterID, "lua") != 0 ||
    msg.u.Request.u.InitializeRequest.columnsStartAt1 != 1 ||
    msg.u.Request.u.InitializeRequest.linesStartAt1 != 1 ||
    strcmp(msg.u.Request.u.InitializeRequest.pathFormat, "path") != 0) {
    return 1;
  }
  ProtocolMessage res;
  vscode_make_error_response(&msg, &res, VSCODE_INITIALIZE_RESPONSE,
                             "unable to initialize");
  //char buf[1024];
  membuff_t mb;
  membuff_init(&mb, 0);
  vscode_serialize_response_new(&mb, &res);
  //printf(buf);
  const char *expected =
      "{\"type\":\"response\",\"seq\":1,\"command\":\"initialize\",\"request_seq\":1,"
      "\"success\":false,\"message\":\"unable to initialize\"}";
  if (strcmp(expected, mb.buf) != 0) {
	  membuff_free(&mb);  
	  return 1;
  }
  vscode_make_success_response(&msg, &res, VSCODE_INITIALIZE_RESPONSE);
  membuff_rewindpos(&mb);
  vscode_serialize_response_new(&mb, &res);
  const char *expected2 =
      "{\"type\":\"response\",\"seq\":2,\"command\":\"initialize\",\"request_seq\":1,"
      "\"success\":true,\"body\":{\"supportsConfigurationDoneRequest\":false,"
      "\"supportsFunctionBreakpoints\":false,"
      "\"supportsConditionalBreakpoints\":false,\"supportsEvaluateForHovers\":"
      "false}}";
  if (strcmp(expected2, mb.buf) != 0) {
	  membuff_free(&mb);  
	  return 1;
  }
  char testdata2[] = "{\"type\":\"request\",\"seq\":2,\"command\":\"setBreakpoints\",\"arguments\":{\"source\":{\"path\":\"c:\\\\github\\\\ravi\\\\ravi-tests\\\\simple.lua\"},\"lines\" : [6],\"breakpoints\" : [{\"line\":6}]} }";
  msgtype = vscode_parse_message(testdata2, strlen(testdata2), &msg, stderr);
  if (msgtype != VSCODE_SET_BREAKPOINTS_REQUEST || msg.seq != 2 ||
    msg.type != VSCODE_REQUEST ||
    strcmp(msg.u.Request.command, "setBreakpoints") != 0 ||
    msg.u.Request.request_type != VSCODE_SET_BREAKPOINTS_REQUEST ||
    strcmp(msg.u.Request.u.SetBreakpointsRequest.source.path, "c:/github/ravi/ravi-tests/simple.lua") != 0 ||
    msg.u.Request.u.SetBreakpointsRequest.breakpoints[0].line != 6) {
	  membuff_free(&mb);  
	  return 1;
  }
  membuff_free(&mb);
  return 0;
}